

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Accuracy::TextureCubeFilteringCase::deinit(TextureCubeFilteringCase *this)

{
  TextureCube *this_00;
  pointer ppTVar1;
  pointer ppTVar2;
  
  ppTVar1 = (this->m_textures).
            super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar2 = (this->m_textures).
                 super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppTVar2 != ppTVar1; ppTVar2 = ppTVar2 + 1) {
    this_00 = *ppTVar2;
    if (this_00 != (TextureCube *)0x0) {
      glu::TextureCube::~TextureCube(this_00);
      operator_delete(this_00,0x180);
    }
    ppTVar1 = (this->m_textures).
              super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppTVar2 = (this->m_textures).
            super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar1 != ppTVar2) {
    (this->m_textures).super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppTVar2;
  }
  deqp::gls::TextureTestUtil::TextureRenderer::clear(&this->m_renderer);
  return;
}

Assistant:

void TextureCubeFilteringCase::deinit (void)
{
	for (std::vector<glu::TextureCube*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
		delete *i;
	m_textures.clear();

	m_renderer.clear();
}